

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test1.cpp
# Opt level: O1

void affineMatrixTest1(void)

{
  AffineMatrix4T<float> *this;
  size_t i;
  ostream *poVar1;
  long lVar2;
  float *in_R8;
  float trace;
  float fVar3;
  Vector<float,_3UL> result;
  AffineMatrix4 B;
  Matrix4 A2;
  Matrix4 A;
  float local_15c;
  Matrix<float,_4UL,_4UL> local_158;
  undefined1 local_118 [52];
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float afStack_c0 [2];
  Matrix<float,_4UL,_4UL> local_b8;
  Matrix<float,_4UL,_4UL> local_70;
  
  local_b8.m_[0xc] = 0.0;
  local_b8.m_[0xd] = 0.0;
  local_b8.m_[0xe] = 0.0;
  local_b8.m_[0xf] = 1.0;
  local_b8.m_[8] = 0.0;
  local_b8.m_[9] = 1.0;
  local_b8.m_[10] = 2.0;
  local_b8.m_[0xb] = 0.0;
  local_b8.m_[4] = 0.0;
  local_b8.m_[5] = 8.0;
  local_b8.m_[6] = 0.0;
  local_b8.m_[7] = -4.0;
  local_b8.m_[0] = 1.0;
  local_b8.m_[1] = 0.0;
  local_b8.m_[2] = -2.0;
  local_b8.m_[3] = 6.0;
  local_158.m_[2] = 2.24208e-44;
  local_158.m_[3] = 0.0;
  local_158.m_._0_8_ = &local_b8;
  Gs::Matrix<float,_4UL,_4UL>::Matrix(&local_70,(initializer_list<float> *)&local_158);
  local_b8.m_[8] = 0.0;
  local_b8.m_[9] = 1.0;
  local_b8.m_[10] = 2.0;
  local_b8.m_[0xb] = 0.0;
  local_b8.m_[4] = 0.0;
  local_b8.m_[5] = 8.0;
  local_b8.m_[6] = 0.0;
  local_b8.m_[7] = -4.0;
  local_b8.m_[0] = 1.0;
  local_b8.m_[1] = 0.0;
  local_b8.m_[2] = -2.0;
  local_b8.m_[3] = 6.0;
  local_158.m_[2] = 1.68156e-44;
  local_158.m_[3] = 0.0;
  this = (AffineMatrix4T<float> *)(local_118 + 0x30);
  local_158.m_._0_8_ = &local_b8;
  Gs::AffineMatrix4T<float>::AffineMatrix4T(this,(initializer_list<float> *)&local_158);
  local_b8.m_[0xc] = local_70.m_[0xc];
  local_b8.m_[0xd] = local_70.m_[0xd];
  local_b8.m_[0xe] = local_70.m_[0xe];
  local_b8.m_[0xf] = local_70.m_[0xf];
  local_b8.m_[8] = local_70.m_[8];
  local_b8.m_[9] = local_70.m_[9];
  local_b8.m_[10] = local_70.m_[10];
  local_b8.m_[0xb] = local_70.m_[0xb];
  local_b8.m_[4] = local_70.m_[4];
  local_b8.m_[5] = local_70.m_[5];
  local_b8.m_[6] = local_70.m_[6];
  local_b8.m_[7] = local_70.m_[7];
  local_b8.m_[0] = local_70.m_[0];
  local_b8.m_[1] = local_70.m_[1];
  local_b8.m_[2] = local_70.m_[2];
  local_b8.m_[3] = local_70.m_[3];
  local_118._0_4_ = 1.0;
  local_118._4_4_ = 1.0;
  local_118._8_4_ = 1.0;
  Gs::Normalize<Gs::Vector<float,3ul>,float>
            ((Vector<float,_3UL> *)&local_158,(Vector<float,_3UL> *)local_118);
  local_15c = 1.5707964;
  Gs::RotateFree<Gs::Matrix<float,4ul,4ul>,float>
            (&local_b8,(Vector<float,_3UL> *)&local_158,&local_15c);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"A = ",4);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
  std::ostream::put(-0x50);
  poVar1 = (ostream *)std::ostream::flush();
  poVar1 = Gs::operator<<(poVar1,&local_70);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"B = ",4);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
  std::ostream::put(-0x50);
  poVar1 = (ostream *)std::ostream::flush();
  poVar1 = Gs::Details::ShiftAffineMatrixOStream<Gs::AffineMatrix4T<float>,float>(poVar1,this);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"B^T = ",6);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
  std::ostream::put(-0x50);
  poVar1 = (ostream *)std::ostream::flush();
  Gs::AffineMatrix4T<float>::Transposed(this);
  poVar1 = Gs::operator<<(poVar1,&local_158);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Inv(B) = ",9);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
  std::ostream::put(-0x50);
  poVar1 = (ostream *)std::ostream::flush();
  local_118._40_4_ = afStack_c0[0];
  local_118._44_4_ = afStack_c0[1];
  local_158.m_[10] = afStack_c0[0];
  local_158.m_[0xb] = afStack_c0[1];
  Gs::Inverse<float>((AffineMatrix4T<float> *)local_118,(AffineMatrix4T<float> *)&local_158);
  poVar1 = Gs::Details::ShiftAffineMatrixOStream<Gs::AffineMatrix4T<float>,float>
                     (poVar1,(AffineMatrix4T<float> *)local_118);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"B*Inv(B) = ",0xb);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
  std::ostream::put(-0x50);
  poVar1 = (ostream *)std::ostream::flush();
  local_118._4_4_ = fStack_e4;
  local_118._8_8_ = CONCAT44(fStack_dc,fStack_e0);
  local_118._20_4_ = fStack_d4;
  local_118._16_4_ = local_d8;
  local_118._28_4_ = fStack_cc;
  local_118._24_4_ = fStack_d0;
  local_118._40_4_ = afStack_c0[0];
  local_118._44_4_ = afStack_c0[1];
  local_158.m_[10] = afStack_c0[0];
  local_158.m_[0xb] = afStack_c0[1];
  Gs::Inverse<float>((AffineMatrix4T<float> *)local_118,(AffineMatrix4T<float> *)&local_158);
  Gs::Details::MulAffineMatrices<Gs::AffineMatrix4T,float>(this,(AffineMatrix4T<float> *)local_118);
  poVar1 = Gs::Details::ShiftAffineMatrixOStream<Gs::AffineMatrix4T<float>,float>
                     (poVar1,(AffineMatrix4T<float> *)&local_158);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"| A | = ",8);
  fVar3 = Gs::Determinant<float>(&local_70);
  poVar1 = std::ostream::_M_insert<double>((double)fVar3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"| B | = ",8);
  poVar1 = std::ostream::_M_insert<double>
                     ((double)((fStack_dc * fStack_cc - local_d8 * fStack_d0) * fStack_e0 +
                              (((float)local_118._48_4_ * local_d8 - fStack_e4 * fStack_dc) *
                               local_c8 -
                              ((float)local_118._48_4_ * fStack_cc - fStack_e4 * fStack_d0) *
                              fStack_d4)));
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Trace A = ",10);
  fVar3 = 0.0;
  lVar2 = 0;
  do {
    fVar3 = fVar3 + *(float *)((long)local_70.m_ + lVar2);
    lVar2 = lVar2 + 0x14;
  } while (lVar2 != 0x50);
  poVar1 = std::ostream::_M_insert<double>((double)fVar3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Trace B = ",10);
  poVar1 = std::ostream::_M_insert<double>
                     ((double)((float)local_118._48_4_ + local_d8 + local_c8 + 1.0));
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
  std::ostream::put(-0x50);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"A1 = ",5);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  poVar1 = Gs::operator<<(poVar1,&local_70);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
  std::ostream::put(-0x50);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"A2 = ",5);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  poVar1 = Gs::operator<<(poVar1,&local_b8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
  std::ostream::put(-0x50);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Lerp(A1, A2, 0.5) = ",0x14);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  local_118._0_4_ = 0x3f000000;
  Gs::Lerp<Gs::Matrix<float,4ul,4ul>,float>
            (&local_158,(Gs *)&local_70,&local_b8,(Matrix<float,_4UL,_4UL> *)local_118,in_R8);
  poVar1 = Gs::operator<<(poVar1,&local_158);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
  std::ostream::put(-0x50);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"5 * I3 = ",9);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  Gs::Matrix<float,_3UL,_3UL>::Identity();
  local_158.m_[4] = (float)local_118._16_4_;
  local_158.m_[5] = (float)local_118._20_4_;
  local_158.m_[6] = (float)local_118._24_4_;
  local_158.m_[7] = (float)local_118._28_4_;
  local_158.m_[0] = (float)local_118._0_4_;
  local_158.m_[1] = (float)local_118._4_4_;
  local_158.m_[2] = (float)local_118._8_4_;
  local_158.m_[3] = (float)local_118._12_4_;
  lVar2 = 0;
  do {
    local_158.m_[lVar2] = local_158.m_[lVar2] * 5.0;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 9);
  poVar1 = Gs::operator<<(poVar1,(Matrix<float,_3UL,_3UL> *)&local_158);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void affineMatrixTest1()
{
    Matrix4 A
    {
        1, 0, -2, 6,
        0, 8, 0, -4,
        0, 1, 2, 0,
        0, 0, 0, 1
    };

    AffineMatrix4 B
    {
        1, 0, -2, 6,
        0, 8, 0, -4,
        0, 1, 2, 0
    };

    auto A2 = A;
    RotateFree(A2, Vector3(1, 1, 1).Normalized(), pi*0.5f);
    //B.MakeInverse();

    std::cout << "A = " << std::endl << A << std::endl;
    #if GS_ENABLE_INVERSE_OPERATOR
    std::cout << "Inv(A) = " << std::endl << (A^-1) << std::endl;
    std::cout << "A*Inv(A) = " << std::endl << A*(A^-1) << std::endl;
    #endif
    std::cout << "B = " << std::endl << B << std::endl;
    std::cout << "B^T = " << std::endl << B.Transposed() << std::endl;
    std::cout << "Inv(B) = " << std::endl << B.Inverse() << std::endl;
    std::cout << "B*Inv(B) = " << std::endl << B*B.Inverse() << std::endl;
    std::cout << "| A | = " << A.Determinant() << std::endl;
    std::cout << "| B | = " << B.Determinant() << std::endl;
    std::cout << "Trace A = " << A.Trace() << std::endl;
    std::cout << "Trace B = " << B.Trace() << std::endl;
    std::cout << std::endl << "A1 = " << std::endl << A << std::endl;
    std::cout << std::endl << "A2 = " << std::endl << A2 << std::endl;
    std::cout << std::endl << "Lerp(A1, A2, 0.5) = " << std::endl << Lerp(A, A2, 0.5f) << std::endl;
    std::cout << std::endl << "5 * I3 = " << std::endl << Real(5) * Matrix3::Identity() << std::endl;
}